

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SQLiteBuildDB.cpp
# Opt level: O2

unique_ptr<llbuild::core::BuildDB,_std::default_delete<llbuild::core::BuildDB>_> __thiscall
llbuild::core::createSQLiteBuildDB
          (core *this,StringRef path,uint32_t clientSchemaVersion,bool recreateUnmatchedVersion,
          string *error_out)

{
  undefined8 *puVar1;
  StringRef local_40;
  
  puVar1 = (undefined8 *)operator_new(0xd8);
  *puVar1 = &PTR__SQLiteBuildDB_001db6f0;
  local_40.Data = path.Data;
  local_40.Length = path.Length;
  llvm::StringRef::str_abi_cxx11_((string *)(puVar1 + 1),&local_40);
  *(uint32_t *)(puVar1 + 5) = clientSchemaVersion;
  *(bool *)((long)puVar1 + 0x2c) = recreateUnmatchedVersion;
  puVar1[6] = 0;
  puVar1[7] = 0;
  puVar1[8] = 0;
  puVar1[9] = 0;
  puVar1[10] = 0;
  puVar1[0xb] = 0;
  puVar1[0xc] = 0;
  puVar1[0xd] = 0;
  puVar1[0xe] = 0;
  puVar1[0xf] = 0;
  puVar1[0x10] = 0;
  puVar1[0x11] = 0;
  puVar1[0x12] = 0;
  puVar1[0x13] = 0;
  puVar1[0x14] = 0;
  llvm::
  DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
  ::init((DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
          *)(puVar1 + 0x15),(EVP_PKEY_CTX *)0x0);
  llvm::
  DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
  ::init((DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
          *)(puVar1 + 0x18),(EVP_PKEY_CTX *)0x0);
  *(undefined8 **)this = puVar1;
  return (__uniq_ptr_data<llbuild::core::BuildDB,_std::default_delete<llbuild::core::BuildDB>,_true,_true>
          )(__uniq_ptr_data<llbuild::core::BuildDB,_std::default_delete<llbuild::core::BuildDB>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<BuildDB> core::createSQLiteBuildDB(StringRef path,
                                                   uint32_t clientSchemaVersion,
                                                   bool recreateUnmatchedVersion,
                                                   std::string *error_out) {
  return llvm::make_unique<SQLiteBuildDB>(path, clientSchemaVersion, recreateUnmatchedVersion);
}